

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::RgbaOutputFile::RgbaOutputFile
          (RgbaOutputFile *this,OStream *os,Header *header,RgbaChannels rgbaChannels,int numThreads)

{
  void *pvVar1;
  uint in_ECX;
  undefined8 *in_RDI;
  RgbaChannels in_stack_00000014;
  OutputFile *in_stack_00000018;
  ToYca *in_stack_00000020;
  RgbaChannels in_stack_0000002c;
  Header hd;
  int in_stack_0000018c;
  Header *in_stack_00000190;
  OStream *in_stack_00000198;
  OutputFile *in_stack_000001a0;
  Header *this_00;
  Header *in_stack_ffffffffffffffa8;
  Header *in_stack_ffffffffffffffb0;
  
  *in_RDI = &PTR__RgbaOutputFile_002acfb0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  this_00 = (Header *)&stack0xffffffffffffffa8;
  Header::Header(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  anon_unknown_1::insertChannels((Header *)hd._map._M_t._M_impl._0_8_,in_stack_0000002c);
  pvVar1 = operator_new(0x10);
  OutputFile::OutputFile(in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_0000018c);
  in_RDI[1] = pvVar1;
  if ((in_ECX & 0x30) != 0) {
    pvVar1 = operator_new(0x160);
    ToYca::ToYca(in_stack_00000020,in_stack_00000018,in_stack_00000014);
    in_RDI[2] = pvVar1;
  }
  Header::~Header(this_00);
  return;
}

Assistant:

RgbaOutputFile::RgbaOutputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os,
    const Header&                            header,
    RgbaChannels                             rgbaChannels,
    int                                      numThreads)
    : _outputFile (0), _toYca (0)
{
    Header hd (header);
    insertChannels (hd, rgbaChannels);
    _outputFile = new OutputFile (os, hd, numThreads);

    if (rgbaChannels & (WRITE_Y | WRITE_C))
        _toYca = new ToYca (*_outputFile, rgbaChannels);
}